

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O2

void __thiscall result_tests::check_value_or::test_method(check_value_or *this)

{
  string original;
  string original_00;
  string original_01;
  string original_02;
  string original_03;
  string original_04;
  bilingual_str s;
  bilingual_str s_00;
  iterator in_R8;
  iterator pvVar1;
  iterator pvVar2;
  iterator in_R9;
  _Variadic_union<bilingual_str,_result_tests::NoCopy> *p_Var3;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  undefined8 in_stack_fffffffffffffc38;
  char *pcVar4;
  undefined8 in_stack_fffffffffffffc40;
  char *pcVar5;
  undefined8 in_stack_fffffffffffffc48;
  undefined1 *puVar6;
  undefined8 in_stack_fffffffffffffc50;
  undefined1 *puVar7;
  undefined8 in_stack_fffffffffffffc58;
  char *pcVar8;
  undefined8 in_stack_fffffffffffffc60;
  char *pcVar9;
  undefined8 in_stack_fffffffffffffc68;
  char *pcVar10;
  undefined **local_380;
  undefined1 local_378;
  undefined1 *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  bilingual_str local_220;
  string local_1e0 [32];
  bilingual_str local_1c0;
  string local_180 [32];
  _Variadic_union<bilingual_str,_result_tests::NoCopy> local_160;
  string local_120 [32];
  bilingual_str local_100;
  undefined1 local_c0 [64];
  _Variadic_union<bilingual_str,_bilingual_str> local_80;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = &DAT_00000058;
  file.m_begin = (iterator)&local_290;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2a0,msg);
  local_c0[8] = 0;
  local_c0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_2a8 = "";
  local_80._0_4_ = 10;
  local_40 = 1;
  local_1c0.original._M_dataplus._M_p._0_4_ = 0x14;
  local_160._0_4_ =
       util::Result<int>::value_or<int>((Result<int> *)&local_80._M_first,(int *)&local_1c0);
  p_Var3 = &local_160;
  local_380._0_4_ = 10;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_c0,&local_2b0,0x58,1,2,p_Var3,"IntFn(10, true).value_or(20)",&local_380,"10");
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_int>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_int> *)&local_80._M_first);
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)p_Var3;
  msg_00.m_begin = pvVar1;
  file_00.m_end = (iterator)0x59;
  file_00.m_begin = (iterator)&local_2c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2d0,
             msg_00);
  local_c0[8] = 0;
  local_c0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_2d8 = "";
  IntFn((Result<int> *)&local_80._M_first,10,false);
  local_1c0.original._M_dataplus._M_p._0_4_ = 0x14;
  local_160._0_4_ =
       util::Result<int>::value_or<int>((Result<int> *)&local_80._M_first,(int *)&local_1c0);
  p_Var3 = &local_160;
  local_380._0_4_ = 0x14;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_c0,&local_2e0,0x59,1,2,p_Var3,"IntFn(10, false).value_or(20)",&local_380,"20");
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_int>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_int> *)&local_80._M_first);
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)p_Var3;
  msg_01.m_begin = pvVar1;
  file_01.m_end = (iterator)0x5a;
  file_01.m_begin = (iterator)&local_2f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_300,
             msg_01);
  local_c0[8] = 0;
  local_c0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_308 = "";
  NoCopyFn((Result<result_tests::NoCopy> *)&local_80._M_first,10,true);
  local_1c0.original._M_dataplus._M_p._0_4_ = 0x14;
  util::Result<result_tests::NoCopy>::value_or<int>
            ((Result<result_tests::NoCopy> *)&local_160._M_first,(int *)&local_80);
  local_380._0_4_ = 10;
  pvVar1 = (iterator)0x2;
  p_Var3 = &local_160;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,result_tests::NoCopy,int>
            (local_c0,&local_310,0x5a,1,2,p_Var3,"NoCopyFn(10, true).value_or(20)",&local_380,"10");
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
            ((unique_ptr<int,_std::default_delete<int>_> *)&local_160._M_first);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_result_tests::NoCopy>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_result_tests::NoCopy> *)
                    &local_80._M_first);
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)p_Var3;
  msg_02.m_begin = pvVar1;
  file_02.m_end = (iterator)0x5b;
  file_02.m_begin = (iterator)&local_320;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_330,
             msg_02);
  local_c0[8] = 0;
  local_c0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_338 = "";
  NoCopyFn((Result<result_tests::NoCopy> *)&local_80._M_first,10,false);
  local_1c0.original._M_dataplus._M_p._0_4_ = 0x14;
  util::Result<result_tests::NoCopy>::value_or<int>
            ((Result<result_tests::NoCopy> *)&local_160._M_first,(int *)&local_80);
  local_380 = (undefined **)CONCAT44(local_380._4_4_,0x14);
  pvVar1 = (iterator)0x2;
  p_Var3 = &local_160;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,result_tests::NoCopy,int>
            (local_c0,&local_340,0x5b,1,2,p_Var3,"NoCopyFn(10, false).value_or(20)",&local_380,"20")
  ;
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
            ((unique_ptr<int,_std::default_delete<int>_> *)&local_160._M_first);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_result_tests::NoCopy>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_result_tests::NoCopy> *)
                    &local_80._M_first);
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)p_Var3;
  msg_03.m_begin = pvVar1;
  file_03.m_end = (iterator)0x5c;
  file_03.m_begin = (iterator)&local_350;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_360,
             msg_03);
  local_378 = 0;
  local_380 = &PTR__lazy_ostream_01139f30;
  local_370 = boost::unit_test::lazy_ostream::inst;
  local_368 = "";
  pcVar10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"A",(allocator<char> *)&stack0xfffffffffffffc6f);
  original._M_string_length = in_stack_fffffffffffffc40;
  original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc38;
  original.field_2._M_allocated_capacity = in_stack_fffffffffffffc48;
  original.field_2._8_8_ = in_stack_fffffffffffffc50;
  Untranslated(&local_100,original);
  s.original._M_string_length = in_stack_fffffffffffffc40;
  s.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc38;
  s.original.field_2._M_allocated_capacity = in_stack_fffffffffffffc48;
  s.original.field_2._8_8_ = in_stack_fffffffffffffc50;
  s.translated._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc58;
  s.translated._M_string_length = in_stack_fffffffffffffc60;
  s.translated.field_2._M_allocated_capacity = in_stack_fffffffffffffc68;
  s.translated.field_2._8_8_ = pcVar10;
  StrFn((Result<bilingual_str> *)&local_80._M_first,s,false);
  std::__cxx11::string::string<std::allocator<char>>
            (local_180,"B",(allocator<char> *)&stack0xfffffffffffffc6e);
  original_00._M_string_length = in_stack_fffffffffffffc40;
  original_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc38;
  original_00.field_2._M_allocated_capacity = in_stack_fffffffffffffc48;
  original_00.field_2._8_8_ = in_stack_fffffffffffffc50;
  Untranslated((bilingual_str *)&local_160._M_first,original_00);
  util::Result<bilingual_str>::value_or<bilingual_str>
            ((T *)local_c0,(Result<bilingual_str> *)&local_80._M_first,
             (bilingual_str *)&local_160._M_first);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e0,"A",(allocator<char> *)&stack0xfffffffffffffc6d);
  original_01._M_string_length = in_stack_fffffffffffffc40;
  original_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc38;
  original_01.field_2._M_allocated_capacity = in_stack_fffffffffffffc48;
  original_01.field_2._8_8_ = in_stack_fffffffffffffc50;
  Untranslated(&local_1c0,original_01);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_c0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bilingual_str,bilingual_str>
            (&local_380,&stack0xfffffffffffffc70,0x5c,1,2,pvVar1,
             "StrFn(Untranslated(\"A\"), true).value_or(Untranslated(\"B\"))",&local_1c0,
             "Untranslated(\"A\")");
  bilingual_str::~bilingual_str(&local_1c0);
  std::__cxx11::string::~string(local_1e0);
  bilingual_str::~bilingual_str((bilingual_str *)local_c0);
  bilingual_str::~bilingual_str((bilingual_str *)&local_160._M_first);
  std::__cxx11::string::~string(local_180);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_bilingual_str>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_bilingual_str> *)&local_80._M_first);
  bilingual_str::~bilingual_str(&local_100);
  std::__cxx11::string::~string(local_120);
  pcVar8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  pcVar9 = "";
  puVar6 = &boost::unit_test::basic_cstring<char_const>::null;
  puVar7 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar1;
  msg_04.m_begin = pvVar2;
  file_04.m_end = (iterator)0x5d;
  file_04.m_begin = &stack0xfffffffffffffc58;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
             (size_t)&stack0xfffffffffffffc48,msg_04);
  local_378 = 0;
  local_380 = &PTR__lazy_ostream_01139f30;
  local_370 = boost::unit_test::lazy_ostream::inst;
  local_368 = "";
  pcVar4 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  pcVar5 = "";
  std::__cxx11::string::string<std::allocator<char>>
            (local_240,"A",(allocator<char> *)&stack0xfffffffffffffc6f);
  original_02._M_string_length = (size_type)pcVar5;
  original_02._M_dataplus._M_p = pcVar4;
  original_02.field_2._M_allocated_capacity = (size_type)puVar6;
  original_02.field_2._8_8_ = puVar7;
  Untranslated(&local_220,original_02);
  s_00.original._M_string_length = (size_type)pcVar5;
  s_00.original._M_dataplus._M_p = pcVar4;
  s_00.original.field_2._M_allocated_capacity = (size_type)puVar6;
  s_00.original.field_2._8_8_ = puVar7;
  s_00.translated._M_dataplus._M_p = pcVar8;
  s_00.translated._M_string_length = (size_type)pcVar9;
  s_00.translated.field_2._M_allocated_capacity = in_stack_fffffffffffffc68;
  s_00.translated.field_2._8_8_ = pcVar10;
  StrFn((Result<bilingual_str> *)&local_80._M_first,s_00,SUB81(&local_220,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_260,"B",(allocator<char> *)&stack0xfffffffffffffc6e);
  original_03._M_string_length = (size_type)pcVar5;
  original_03._M_dataplus._M_p = pcVar4;
  original_03.field_2._M_allocated_capacity = (size_type)puVar6;
  original_03.field_2._8_8_ = puVar7;
  Untranslated((bilingual_str *)&local_160._M_first,original_03);
  util::Result<bilingual_str>::value_or<bilingual_str>
            ((T *)local_c0,(Result<bilingual_str> *)&local_80._M_first,
             (bilingual_str *)&local_160._M_first);
  std::__cxx11::string::string<std::allocator<char>>
            (local_280,"B",(allocator<char> *)&stack0xfffffffffffffc6d);
  original_04._M_string_length = (size_type)pcVar5;
  original_04._M_dataplus._M_p = pcVar4;
  original_04.field_2._M_allocated_capacity = (size_type)puVar6;
  original_04.field_2._8_8_ = puVar7;
  Untranslated(&local_1c0,original_04);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bilingual_str,bilingual_str>
            (&local_380,&stack0xfffffffffffffc38,0x5d,1,2,local_c0,
             "StrFn(Untranslated(\"A\"), false).value_or(Untranslated(\"B\"))",&local_1c0,
             "Untranslated(\"B\")");
  bilingual_str::~bilingual_str(&local_1c0);
  std::__cxx11::string::~string(local_280);
  bilingual_str::~bilingual_str((bilingual_str *)local_c0);
  bilingual_str::~bilingual_str((bilingual_str *)&local_160._M_first);
  std::__cxx11::string::~string(local_260);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_bilingual_str>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_bilingual_str> *)&local_80._M_first);
  bilingual_str::~bilingual_str(&local_220);
  std::__cxx11::string::~string(local_240);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(check_value_or)
{
    BOOST_CHECK_EQUAL(IntFn(10, true).value_or(20), 10);
    BOOST_CHECK_EQUAL(IntFn(10, false).value_or(20), 20);
    BOOST_CHECK_EQUAL(NoCopyFn(10, true).value_or(20), 10);
    BOOST_CHECK_EQUAL(NoCopyFn(10, false).value_or(20), 20);
    BOOST_CHECK_EQUAL(StrFn(Untranslated("A"), true).value_or(Untranslated("B")), Untranslated("A"));
    BOOST_CHECK_EQUAL(StrFn(Untranslated("A"), false).value_or(Untranslated("B")), Untranslated("B"));
}